

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

float stbir__filter_trapezoid(float x,float scale)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float r;
  float t;
  float halfscale;
  float scale_local;
  float x_local;
  
  fVar1 = scale / 2.0 + 0.5;
  if (scale <= 1.0) {
    dVar3 = std::fabs((double)(ulong)(uint)x);
    fVar2 = SUB84(dVar3,0);
    if (fVar2 < fVar1) {
      if (0.5 - scale / 2.0 < fVar2) {
        scale_local = (fVar1 - fVar2) / scale;
      }
      else {
        scale_local = 1.0;
      }
    }
    else {
      scale_local = 0.0;
    }
    return scale_local;
  }
  __assert_fail("scale <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                ,0x2fb,"float stbir__filter_trapezoid(float, float)");
}

Assistant:

static float stbir__filter_trapezoid(float x, float scale)
{
    float halfscale = scale / 2;
    float t = 0.5f + halfscale;
    STBIR_ASSERT(scale <= 1);

    x = (float)fabs(x);

    if (x >= t)
        return 0;
    else
    {
        float r = 0.5f - halfscale;
        if (x <= r)
            return 1;
        else
            return (t - x) / scale;
    }
}